

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  string *psVar8;
  string param_name;
  string image_name;
  string param_win_name;
  Mat raw_imgl;
  VideoCapture vcapture;
  Mat rect_imgl;
  Mat raw_img;
  Mat small_img;
  Mat rect_imgr;
  Mat raw_imgr;
  char win_name [256];
  long *local_4a0;
  char *local_498;
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  Size *local_460;
  Mat *local_458;
  Size local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  _InputArray local_420;
  void *local_408;
  undefined1 *puStack_400;
  Size local_3f8;
  long *local_3e8 [2];
  long local_3d8 [10];
  undefined8 local_388;
  string local_380;
  VideoCapture local_360 [48];
  _InputArray local_330;
  Mat local_318 [96];
  Mat local_2b8 [96];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  Mat local_1f8 [96];
  Mat local_198 [96];
  string local_138 [264];
  
  local_4a0 = local_490;
  psVar8 = (string *)&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>(psVar8,"../astar_calicam_mono.yml","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"../times_square.jpg","");
  pcVar2 = local_498;
  if (argc == 2) {
    lVar6 = 8;
LAB_00104fa1:
    pcVar2 = *(char **)((long)argv + lVar6);
    pcVar1 = *(char **)(psVar8 + 8);
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar1,(ulong)pcVar2);
  }
  else if (argc == 3) {
    pcVar1 = argv[1];
    strlen(pcVar1);
    lVar6 = 0x10;
    std::__cxx11::string::_M_replace((ulong)&local_4a0,0,pcVar2,(ulong)pcVar1);
    psVar8 = (string *)local_480;
    goto LAB_00104fa1;
  }
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_4a0,local_498 + (long)local_4a0);
  LoadParameters(&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  InitRectifyMap();
  cv::Mat::Mat(local_2b8);
  cv::VideoCapture::VideoCapture(local_360);
  if (live == true) {
    cv::VideoCapture::open((int)local_360,0);
    cVar3 = cv::VideoCapture::isOpened();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Camera doesn\'t work",0x13);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_001056e7;
    }
    cv::VideoCapture::set((int)local_360,(double)cap_cols);
    cv::VideoCapture::set((int)local_360,(double)cap_rows);
    cv::VideoCapture::set((int)local_360,30.0);
  }
  else {
    cv::imread(local_138,(int)local_480);
    cv::Mat::operator=(local_2b8,(Mat *)local_138);
    cv::Mat::~Mat((Mat *)local_138);
  }
  sprintf((char *)local_138,"Raw Image: %d x %d",(ulong)(uint)cap_cols,(ulong)(uint)cap_rows);
  local_440[0] = local_430;
  sVar5 = strlen((char *)local_138);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,local_138,local_138 + sVar5);
  cv::namedWindow((string *)local_440,1);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"V. FoV:  60    +","");
  cv::createTrackbar((string *)local_3e8,(string *)local_440,(int *)0x0,vfov_max,OnTrackAngle,
                     (void *)0x0);
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"V. FoV:  60    +","");
  cv::setTrackbarPos((string *)local_3e8,(string *)local_440,vfov_bar);
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Size:  480 +","");
  cv::createTrackbar((string *)local_3e8,(string *)local_440,(int *)0x0,size_max,OnTrackSize,
                     (void *)0x0);
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  cv::Mat::Mat((Mat *)local_3e8);
  cv::Mat::Mat(local_198);
  cv::Mat::Mat(local_318);
  cv::Mat::Mat(local_1f8);
  while( true ) {
    if (changed == true) {
      InitRectifyMap();
      changed = false;
    }
    if (live == true) {
      cv::VideoCapture::operator>>(local_360,local_2b8);
    }
    lVar6 = cv::Mat::total();
    if (lVar6 == 0) break;
    cv::Mat::operator=((Mat *)local_3e8,local_2b8);
    local_450[0].width = 0;
    local_450[0].height = 0;
    local_460._0_4_ = 0x1010000;
    local_420.sz.width = 0;
    local_420.sz.height = 0;
    local_420.flags = 0x2010000;
    local_420.obj = local_318;
    local_3f8.width = 0;
    local_3f8.height = 0;
    local_408 = (void *)CONCAT44(local_408._4_4_,0x1010000);
    puStack_400 = fmap;
    local_330.sz.width = 0;
    local_330.sz.height = 0;
    local_330.flags = 0x1010000;
    local_330.obj = fmap + 0x60;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_458 = local_2b8;
    cv::remap((_InputArray *)&local_460,(_OutputArray *)&local_420,(_InputArray *)&local_408,
              &local_330,1,0,(Scalar_ *)&local_258);
    cv::Mat::Mat((Mat *)&local_258);
    local_450[0].width = 0;
    local_450[0].height = 0;
    local_460._0_4_ = 0x1010000;
    local_458 = (Mat *)local_3e8;
    local_420.sz.width = 0;
    local_420.sz.height = 0;
    local_420.flags = 0x2010000;
    local_388 = 0;
    local_420.obj = (Mat *)&local_258;
    cv::resize(0,0x3fe0000000000000,(_InputArray *)&local_460,&local_420,&local_388,1);
    local_450[0].width = 0;
    local_450[0].height = 0;
    local_460 = (Size *)CONCAT44(local_460._4_4_,0x1010000);
    local_458 = (Mat *)&local_258;
    cv::imshow((string *)local_440,(_InputArray *)&local_460);
    local_460 = local_450;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"Rectified Image","");
    local_420.sz.width = 0;
    local_420.sz.height = 0;
    local_420.flags = 0x1010000;
    local_420.obj = local_318;
    cv::imshow((string *)&local_460,&local_420);
    if (local_460 != local_450) {
      operator_delete(local_460,(long)local_450[0] + 1);
    }
    uVar4 = cv::waitKey(1);
    iVar7 = uVar4 * 0x1000000;
    if (iVar7 < 0x32000000) {
      if (iVar7 == 0x20000000) {
        local_460 = local_450;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"img.jpg","");
        local_420.sz.width = 0;
        local_420.sz.height = 0;
        local_420.flags = 0x1010000;
        local_420.obj = local_318;
        local_3f8.width = 0;
        local_3f8.height = 0;
        local_408 = (void *)0x0;
        puStack_400 = (undefined1 *)0x0;
        cv::imwrite((string *)&local_460,&local_420,(vector *)&local_408);
        if (local_408 != (void *)0x0) {
          operator_delete(local_408,(long)local_3f8 - (long)local_408);
        }
        if (local_460 != local_450) {
          operator_delete(local_460,(long)local_450[0] + 1);
        }
      }
      else if (iVar7 == 0x31000000) {
        mode = RECT_PERSPECTIVE;
        goto LAB_00105530;
      }
    }
    else {
      if (iVar7 == 0x32000000) {
        mode = RECT_CYLINDRICAL;
      }
      else if (iVar7 == 0x33000000) {
        mode = RECT_FISHEYE;
      }
      else {
        if (iVar7 != 0x34000000) goto LAB_00105537;
        mode = RECT_LONGLAT;
      }
LAB_00105530:
      changed = true;
    }
LAB_00105537:
    cv::Mat::~Mat((Mat *)&local_258);
    if (((uVar4 & 0xdf) == 0x51) || (iVar7 == 0x1b000000)) {
      cv::Mat::~Mat(local_1f8);
      cv::Mat::~Mat(local_318);
      cv::Mat::~Mat(local_198);
      cv::Mat::~Mat((Mat *)local_3e8);
      if (local_440[0] != local_430) {
        operator_delete(local_440[0],local_430[0] + 1);
      }
      cv::VideoCapture::~VideoCapture(local_360);
      cv::Mat::~Mat(local_2b8);
      if (local_480[0] != local_470) {
        operator_delete(local_480[0],local_470[0] + 1);
      }
      if (local_4a0 != local_490) {
        operator_delete(local_4a0,local_490[0] + 1);
      }
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Image capture error",0x13);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_001056e7:
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
  std::string param_name = "../astar_calicam_mono.yml";
  std::string image_name = "../times_square.jpg";

  if (argc == 2) {
    param_name = argv[1];
  } else if (argc == 3) {
    param_name = argv[1];
    image_name = argv[2];
  }

  LoadParameters(param_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread(image_name, cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", cap_cols, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr,   vfov_max,   OnTrackAngle);
  cv::setTrackbarPos("V. FoV:  60    +", param_win_name, vfov_bar);
  cv::createTrackbar("Size:  480 +", param_win_name, nullptr,  size_max,  OnTrackSize);

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    raw_imgl = raw_img;
    cv::remap(raw_img, rect_imgl, fmap[0], fmap[1], 1, 0);

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    char key = cv::waitKey(1);

    if (key == '1') {
      mode = RECT_PERSPECTIVE;
      changed = true;
    }

    if (key == '2') {
      mode = RECT_CYLINDRICAL;
      changed = true;
    }

    if (key == '3') {
      mode = RECT_FISHEYE;
      changed = true;
    }

    if (key == '4') {
      mode = RECT_LONGLAT;
      changed = true;
    }

    if (key == 32) {
      imwrite("img.jpg", rect_imgl);
    }

    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}